

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O0

void __thiscall TileWire::addUpdate(TileWire *this,bool isCosmetic,bool noAdjacentUpdates)

{
  byte in_DL;
  byte in_SIL;
  Tile *in_RDI;
  Tile *in_stack_00000010;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  unordered_set<Tile_*,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<Tile_*>_>
  *in_stack_ffffffffffffffd0;
  
  Tile::getBoardPtr(in_RDI);
  std::unordered_set<Tile_*,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<Tile_*>_>::
  insert(in_stack_ffffffffffffffd0,
         (value_type *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  if ((in_SIL & 1) == 0) {
    Tile::getBoardPtr(in_RDI);
    std::
    unordered_set<TileWire_*,_std::hash<TileWire_*>,_std::equal_to<TileWire_*>,_std::allocator<TileWire_*>_>
    ::insert((unordered_set<TileWire_*,_std::hash<TileWire_*>,_std::equal_to<TileWire_*>,_std::allocator<TileWire_*>_>
              *)in_RDI,(value_type *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
    if ((in_DL & 1) == 0) {
      Tile::_updateAdjacentTiles(in_stack_00000010);
    }
  }
  return;
}

Assistant:

void TileWire::addUpdate(bool isCosmetic, bool noAdjacentUpdates) {
    getBoardPtr()->cosmeticUpdates.insert(this);
    if (!isCosmetic) {
        getBoardPtr()->wireUpdates.insert(this);
        if (!noAdjacentUpdates) {
            _updateAdjacentTiles();
        }
    }
}